

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_calculation.cc
# Opt level: O1

bool __thiscall
sptk::HistogramCalculation::Run
          (HistogramCalculation *this,vector<double,_std::allocator<double>_> *data,
          vector<double,_std::allocator<double>_> *histogram)

{
  double dVar1;
  int iVar2;
  pointer __s;
  pointer pdVar3;
  long lVar4;
  bool bVar5;
  ulong uVar6;
  uint uVar7;
  double dVar8;
  
  if (this->is_valid_ != true) {
    return false;
  }
  bVar5 = false;
  if ((histogram != (vector<double,_std::allocator<double>_> *)0x0) &&
     (bVar5 = false,
     (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
     _M_start !=
     (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
     _M_finish)) {
    if ((long)(histogram->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(histogram->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 != (long)this->num_bin_) {
      std::vector<double,_std::allocator<double>_>::resize(histogram,(long)this->num_bin_);
    }
    __s = (histogram->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start;
    pdVar3 = (histogram->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (__s != pdVar3) {
      memset(__s,0,((long)pdVar3 + (-8 - (long)__s) & 0xfffffffffffffff8U) + 8);
    }
    pdVar3 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    bVar5 = true;
    uVar7 = (uint)((ulong)((long)(data->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                 .super__Vector_impl_data._M_finish - (long)pdVar3) >> 3);
    if (0 < (int)uVar7) {
      iVar2 = this->num_bin_;
      uVar6 = 0;
      do {
        dVar8 = this->upper_bound_;
        dVar1 = pdVar3[uVar6];
        if ((dVar1 < this->lower_bound_) || (dVar8 <= dVar1)) {
          if ((dVar8 == dVar1) && (lVar4 = (long)iVar2 + -1, !NAN(dVar8) && !NAN(dVar1)))
          goto LAB_00105894;
        }
        else {
          dVar8 = floor((dVar1 - this->lower_bound_) / this->bin_width_);
          lVar4 = (long)(int)dVar8;
LAB_00105894:
          __s[lVar4] = __s[lVar4] + 1.0;
        }
        uVar6 = uVar6 + 1;
      } while ((uVar7 & 0x7fffffff) != uVar6);
      bVar5 = true;
    }
  }
  return bVar5;
}

Assistant:

bool HistogramCalculation::Run(const std::vector<double>& data,
                               std::vector<double>* histogram) const {
  // Check inputs.
  if (!is_valid_ || data.empty() || NULL == histogram) {
    return false;
  }

  // Prepare memories.
  if (histogram->size() != static_cast<std::size_t>(num_bin_)) {
    histogram->resize(num_bin_);
  }

  std::fill(histogram->begin(), histogram->end(), 0.0);

  const int length(static_cast<int>(data.size()));
  const double* input(&(data[0]));
  double* output(&((*histogram)[0]));
  for (int i(0); i < length; ++i) {
    if (lower_bound_ <= input[i] && input[i] < upper_bound_) {
      const int bin_index(
          static_cast<int>(std::floor((input[i] - lower_bound_) / bin_width_)));
      ++output[bin_index];
    } else if (upper_bound_ == input[i]) {
      ++output[num_bin_ - 1];
    }
  }

  return true;
}